

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O0

LoadInstr * __thiscall
flow::IRBuilder::insert<flow::LoadInstr,flow::Value*&,std::__cxx11::string>
          (IRBuilder *this,Value **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  Instr *pIVar1;
  unique_ptr<flow::LoadInstr,_std::default_delete<flow::LoadInstr>_> local_30;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  Value **args_local;
  IRBuilder *this_local;
  
  local_20 = args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (Value **)this;
  std::make_unique<flow::LoadInstr,flow::Value*,std::__cxx11::string>
            ((Value **)&local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::LoadInstr,std::default_delete<flow::LoadInstr>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)&local_28,&local_30);
  pIVar1 = insert(this,&local_28);
  std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr(&local_28);
  std::unique_ptr<flow::LoadInstr,_std::default_delete<flow::LoadInstr>_>::~unique_ptr(&local_30);
  return (LoadInstr *)pIVar1;
}

Assistant:

T* insert(Args&&... args) {
    return static_cast<T*>(insert(std::make_unique<T>(std::move(args)...)));
  }